

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component.cpp
# Opt level: O2

ResetPtr __thiscall libcellml::Component::reset(Component *this,size_t index)

{
  long lVar1;
  __shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  ResetPtr RVar3;
  
  lVar1 = *(long *)(index + 8);
  if (in_RDX._M_pi <
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      (*(long *)(lVar1 + 0xb8) - *(long *)(lVar1 + 0xb0) >> 4)) {
    p_Var2 = &std::
              vector<std::shared_ptr<libcellml::Reset>,_std::allocator<std::shared_ptr<libcellml::Reset>_>_>
              ::at((vector<std::shared_ptr<libcellml::Reset>,_std::allocator<std::shared_ptr<libcellml::Reset>_>_>
                    *)(lVar1 + 0xb0),(size_type)in_RDX._M_pi)->
              super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2> *)this,p_Var2);
    in_RDX._M_pi = extraout_RDX;
  }
  else {
    (this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity._vptr_Entity =
         (_func_int **)0x0;
    (this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl =
         (EntityImpl *)0x0;
  }
  RVar3.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  RVar3.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ResetPtr)RVar3.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ResetPtr Component::reset(size_t index) const
{
    if (index < pFunc()->mResets.size()) {
        return pFunc()->mResets.at(index);
    }

    return nullptr;
}